

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * doctest::detail::
         stringifyBinaryExpr<std::basic_string_view<char,std::char_traits<char>>,char[22]>
                   (basic_string_view<char,_std::char_traits<char>_> *lhs,char *op,char (*rhs) [22])

{
  String *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff58;
  String *in_stack_ffffffffffffff70;
  String *in_stack_ffffffffffffffa0;
  String *in_stack_ffffffffffffffa8;
  
  toString<std::basic_string_view<char,_std::char_traits<char>_>,_true>(in_stack_ffffffffffffff58);
  String::String(in_stack_ffffffffffffff70,(char *)in_RDI);
  doctest::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  toString<char[22],_true>((char (*) [22])in_stack_ffffffffffffff58);
  doctest::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  String::~String(in_stack_ffffffffffffff70);
  String::~String(in_stack_ffffffffffffff70);
  String::~String(in_stack_ffffffffffffff70);
  String::~String(in_stack_ffffffffffffff70);
  return in_RDI;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                                   const DOCTEST_REF_WRAP(R) rhs) {
            // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
            return toString(lhs) + op + toString(rhs);
        }